

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (initialized != 0) {
    post(&exit_message);
    if (nthreads != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        iVar1 = uv_thread_join((uv_thread_t *)((long)threads + lVar2));
        if (iVar1 != 0) {
          abort();
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 8;
      } while (uVar3 < nthreads);
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
    initialized = 0;
  }
  return;
}

Assistant:

static int
cleanup(struct archive_read *a)
{
	struct mtree *mtree;
	struct mtree_entry *p, *q;

	mtree = (struct mtree *)(a->format->data);

	p = mtree->entries;
	while (p != NULL) {
		q = p->next;
		free(p->name);
		free_options(p->options);
		free(p);
		p = q;
	}
	archive_string_free(&mtree->line);
	archive_string_free(&mtree->current_dir);
	archive_string_free(&mtree->contents_name);
	archive_entry_linkresolver_free(mtree->resolver);

	free(mtree->buff);
	free(mtree);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}